

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::CommitDataRequest_ChunkToPatch::ParseFromArray
          (CommitDataRequest_ChunkToPatch *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pCVar2;
  pointer pCVar3;
  uint uVar4;
  undefined1 uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint *extraout_RDX;
  uint *puVar9;
  bool bVar10;
  uint *puVar11;
  ulong uVar12;
  uint *puVar13;
  uint uVar14;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  uint *puVar18;
  pointer pCVar19;
  bool bVar20;
  uint *local_70;
  Field local_68;
  uint *local_58;
  uint *local_50;
  CommitDataRequest_ChunkToPatch *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  vector<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch>_>
  *local_38;
  
  pCVar2 = (this->patches_).
           super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (this->patches_).
           super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar9 = (uint *)size;
  pCVar19 = pCVar2;
  if (pCVar3 != pCVar2) {
    do {
      (**(pCVar19->super_CppMessageObj)._vptr_CppMessageObj)(pCVar19);
      pCVar19 = pCVar19 + 1;
    } while (pCVar19 != pCVar3);
    (this->patches_).
    super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch_Patch>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar2;
    puVar9 = extraout_RDX;
  }
  local_38 = &this->patches_;
  local_40 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar18 = (uint *)(size + (long)raw);
  do {
    lVar8 = 7;
    if (puVar18 <= raw) goto LAB_00227331;
    uVar12 = (ulong)(char)(byte)*raw;
    puVar17 = (uint *)((long)raw + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)*raw;
      uVar7 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar13 = puVar17;
      for (; (uVar12 = uVar7, puVar16 = puVar13, (char)bVar1 < '\0' &&
             (bVar20 = 0x38 < lVar8 - 7U, bVar10 = bVar20 || puVar18 <= puVar13, puVar9 = puVar13,
             uVar12 = 0, puVar16 = puVar17, !bVar20 && puVar18 > puVar13)); lVar8 = lVar8 + 7) {
        bVar1 = (byte)*puVar13;
        puVar13 = (uint *)((long)puVar13 + 1);
        uVar7 = uVar7 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f);
        puVar9 = puVar13;
      }
      puVar17 = puVar16;
      if (bVar10) {
        puVar17 = (uint *)raw;
        uVar12 = 0;
      }
      if (puVar17 == (uint *)raw) goto LAB_00227331;
    }
    uVar6 = (uint)(uVar12 >> 3);
    if ((uVar6 == 0) || (puVar18 <= puVar17)) {
switchD_00227197_caseD_3:
      bVar10 = false;
      uVar12 = 0;
      local_68.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar12 & 7) {
      case 0:
        puVar11 = (uint *)0x0;
        bVar10 = puVar17 >= puVar18;
        if (puVar17 < puVar18) {
          puVar9 = (uint *)((long)puVar17 + 1);
          puVar13 = (uint *)(ulong)((byte)*puVar17 & 0x7f);
          puVar16 = puVar13;
          uVar14 = 0;
          if ((char)(byte)*puVar17 < '\0') {
            puVar16 = (uint *)0x0;
            uVar14 = 0;
            lVar8 = 7;
            puVar15 = puVar9;
            do {
              bVar20 = 0x38 < lVar8 - 7U;
              bVar10 = bVar20 || puVar18 <= puVar15;
              if (bVar20 || puVar18 <= puVar15) goto LAB_00227338;
              uVar4 = *puVar15;
              puVar15 = (uint *)((long)puVar15 + 1);
              puVar13 = (uint *)((ulong)puVar13 |
                                (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + 7;
            } while ((char)(byte)uVar4 < '\0');
            puVar16 = (uint *)((ulong)puVar13 & 0xffffffff);
            puVar9 = puVar15;
            uVar14 = (uint)((ulong)puVar13 >> 0x20);
          }
        }
        else {
          puVar16 = (uint *)0x0;
          uVar14 = 0;
        }
LAB_00227338:
        puVar13 = (uint *)(ulong)uVar14;
        if (bVar10) {
          puVar9 = puVar17;
          puVar13 = puVar11;
          puVar16 = puVar11;
        }
        local_70 = puVar17;
        local_50 = (uint *)raw;
        if (puVar9 != puVar17) goto LAB_0022735f;
        uVar12 = 0;
        bVar10 = false;
        local_68.int_value_ = (uint64_t)puVar11;
        goto LAB_002273a1;
      case 1:
        puVar9 = puVar17 + 2;
        if (puVar18 < puVar9) {
LAB_00227331:
          uVar12 = 0;
          bVar10 = false;
          local_68.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_002273a1;
        }
        puVar16 = *(uint **)puVar17;
        puVar13 = (uint *)((ulong)puVar16 >> 0x20);
        break;
      case 2:
        bVar10 = puVar17 >= puVar18;
        puVar16 = local_58;
        if (puVar17 < puVar18) {
          puVar13 = (uint *)((long)puVar17 + 1);
          puVar11 = (uint *)(ulong)((byte)*puVar17 & 0x7f);
          puVar9 = puVar13;
          puVar16 = puVar11;
          if ((char)(byte)*puVar17 < '\0') {
            lVar8 = 7;
            puVar15 = puVar13;
            do {
              bVar10 = 0x38 < lVar8 - 7U || puVar18 <= puVar15;
              puVar9 = puVar13;
              puVar16 = local_58;
              if (bVar10) break;
              uVar14 = *puVar15;
              puVar9 = (uint *)((long)puVar15 + 1);
              puVar11 = (uint *)((ulong)puVar11 |
                                (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + 7;
              puVar15 = puVar9;
              puVar16 = puVar11;
            } while ((char)(byte)uVar14 < '\0');
          }
        }
        puVar13 = (uint *)0x0;
        local_58 = puVar16;
        if (bVar10) {
          puVar9 = puVar17;
          local_58 = puVar13;
        }
        if (puVar9 == puVar17) {
          puVar16 = (uint *)0x0;
          bVar10 = false;
          puVar11 = (uint *)0x0;
        }
        else if ((uint *)((long)puVar18 - (long)puVar9) < local_58) {
          puVar13 = (uint *)0x0;
          puVar16 = (uint *)0x0;
          bVar10 = false;
          puVar11 = (uint *)0x0;
        }
        else {
          puVar13 = (uint *)((ulong)puVar9 >> 0x20);
          puVar16 = (uint *)((ulong)puVar9 & 0xffffffff);
          puVar9 = (uint *)((long)puVar9 + (long)local_58);
          bVar10 = true;
          puVar11 = local_58;
        }
        local_70 = puVar17;
        if (!bVar10) goto LAB_00227331;
        goto LAB_0022735f;
      default:
        goto switchD_00227197_caseD_3;
      case 5:
        puVar9 = puVar17 + 1;
        puVar13 = (uint *)0x0;
        if (puVar18 < puVar9) goto LAB_00227331;
        puVar16 = (uint *)(ulong)*puVar17;
      }
      puVar11 = (uint *)0x0;
LAB_0022735f:
      bVar10 = true;
      raw = puVar9;
      if ((uVar6 < 0x10000) && (puVar11 < (uint *)0x10000000)) {
        local_68.int_value_ = (ulong)puVar16 & 0xffffffff | (long)puVar13 << 0x20;
        uVar12 = (ulong)puVar11 | (uVar12 >> 3) << 0x20 | (ulong)((uint)uVar12 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        local_68.int_value_ = 0;
        uVar12 = 0;
      }
    }
LAB_002273a1:
    puVar17 = &switchD_00227197::switchdataD_0034ce70;
    if (!bVar10) {
      local_68.size_ = (uint32_t)uVar12;
      local_68.type_ = (uint8_t)(uVar12 >> 0x30);
      local_68.id_ = (uint16_t)(uVar12 >> 0x20);
      local_48 = this;
      do {
        if (local_68.id_ == 0) {
          return puVar18 == (uint *)raw;
        }
        if ((ushort)(uVar12 >> 0x20) < 6) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar12 >> 0x20) & 0x3f);
        }
        uVar6 = ((uint)(uVar12 >> 0x20) & 0xffff) - 1;
        if (uVar6 < 5) {
          uVar5 = (*(code *)(&DAT_0034ce88 + *(int *)(&DAT_0034ce88 + (ulong)uVar6 * 4)))();
          return (bool)uVar5;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_68,local_40);
        do {
          if (puVar18 <= raw) goto LAB_00227599;
          uVar12 = (ulong)(char)(byte)*raw;
          puVar9 = (uint *)((long)raw + 1);
          if ((long)uVar12 < 0) {
            uVar7 = (ulong)((byte)*raw & 0x7f);
            bVar10 = false;
            uVar12 = uVar7;
            puVar13 = puVar9;
            if ((char)(byte)*raw < '\0') {
              lVar8 = 7;
              puVar16 = puVar9;
              do {
                bVar10 = 0x38 < lVar8 - 7U || puVar18 <= puVar16;
                uVar12 = 0;
                puVar13 = puVar9;
                if (bVar10) break;
                uVar6 = *puVar16;
                puVar13 = (uint *)((long)puVar16 + 1);
                uVar7 = uVar7 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar8 & 0x3f);
                lVar8 = lVar8 + 7;
                uVar12 = uVar7;
                puVar16 = puVar13;
              } while ((char)(byte)uVar6 < '\0');
            }
            puVar9 = puVar13;
            if (bVar10) {
              puVar9 = (uint *)raw;
              uVar12 = 0;
            }
            if (puVar9 == (uint *)raw) goto LAB_00227599;
          }
          uVar6 = (uint)(uVar12 >> 3);
          if ((uVar6 == 0) || (puVar18 <= puVar9)) {
switchD_00227618_caseD_3:
            local_68.int_value_ = 0;
            bVar10 = false;
            uVar12 = 0;
            goto LAB_00227840;
          }
          switch((uint)uVar12 & 7) {
          case 0:
            local_68.int_value_ = 0;
            bVar10 = puVar9 >= puVar18;
            if (puVar9 < puVar18) {
              puVar13 = (uint *)((long)puVar9 + 1);
              uVar14 = (byte)*puVar9 & 0x7f;
              uVar7 = (ulong)uVar14;
              puVar16 = (uint *)(ulong)uVar14;
              puVar17 = puVar13;
              uVar14 = 0;
              if ((char)(byte)*puVar9 < '\0') {
                puVar16 = (uint *)0x0;
                lVar8 = 7;
                puVar11 = puVar13;
                do {
                  bVar20 = 0x38 < lVar8 - 7U;
                  bVar10 = bVar20 || puVar18 <= puVar11;
                  puVar17 = puVar13;
                  uVar14 = 0;
                  if (bVar20 || puVar18 <= puVar11) break;
                  bVar1 = (byte)*puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar7 = uVar7 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f);
                  lVar8 = lVar8 + 7;
                  if (-1 < (char)bVar1) {
                    puVar16 = (uint *)(uVar7 & 0xffffffff);
                  }
                  puVar17 = puVar11;
                  uVar14 = (uint)(uVar7 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              puVar16 = (uint *)0x0;
              uVar14 = 0;
            }
            if (bVar10) {
              puVar16 = (uint *)local_68.int_value_;
            }
            puVar13 = (uint *)(ulong)uVar14;
            if (bVar10) {
              puVar17 = puVar9;
              puVar13 = (uint *)local_68.int_value_;
            }
            this = local_48;
            puVar11 = (uint *)local_68.int_value_;
            local_58 = puVar9;
            local_50 = (uint *)raw;
            if (puVar17 == puVar9) {
              uVar12 = 0;
              bVar10 = false;
            }
            else {
LAB_002277f5:
              raw = puVar17;
              bVar10 = true;
              puVar17 = (uint *)raw;
              if ((uVar6 < 0x10000) && (puVar11 < (uint *)0x10000000)) {
                local_68.int_value_ = (ulong)puVar16 & 0xffffffff | (long)puVar13 << 0x20;
                uVar12 = (ulong)puVar11 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
                bVar10 = false;
              }
              else {
                local_68.int_value_ = 0;
                uVar12 = 0;
              }
            }
            break;
          case 1:
            puVar17 = puVar9 + 2;
            if (puVar17 <= puVar18) {
              puVar16 = *(uint **)puVar9;
              puVar13 = (uint *)((ulong)puVar16 >> 0x20);
LAB_00227680:
              puVar11 = (uint *)0x0;
              goto LAB_002277f5;
            }
            goto LAB_00227599;
          case 2:
            bVar10 = puVar9 >= puVar18;
            puVar13 = local_70;
            if (puVar9 < puVar18) {
              puVar16 = (uint *)((long)puVar9 + 1);
              puVar11 = (uint *)(ulong)((byte)*puVar9 & 0x7f);
              puVar17 = puVar16;
              puVar13 = puVar11;
              if ((char)(byte)*puVar9 < '\0') {
                lVar8 = 7;
                puVar15 = puVar16;
                do {
                  bVar10 = 0x38 < lVar8 - 7U || puVar18 <= puVar15;
                  puVar17 = puVar16;
                  puVar13 = local_70;
                  if (bVar10) break;
                  uVar14 = *puVar15;
                  puVar15 = (uint *)((long)puVar15 + 1);
                  puVar11 = (uint *)((ulong)puVar11 |
                                    (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar8 & 0x3f));
                  lVar8 = lVar8 + 7;
                  puVar17 = puVar15;
                  puVar13 = puVar11;
                } while ((char)(byte)uVar14 < '\0');
              }
            }
            local_70 = puVar13;
            if (bVar10) {
              puVar17 = puVar9;
              local_70 = (uint *)0x0;
            }
            if ((puVar17 == puVar9) || ((uint *)((long)puVar18 - (long)puVar17) < local_70)) {
              puVar16 = (uint *)0x0;
              puVar13 = (uint *)0x0;
              bVar10 = false;
              puVar11 = (uint *)0x0;
            }
            else {
              puVar13 = (uint *)((ulong)puVar17 >> 0x20);
              puVar16 = (uint *)((ulong)puVar17 & 0xffffffff);
              puVar17 = (uint *)((long)puVar17 + (long)local_70);
              bVar10 = true;
              puVar11 = local_70;
            }
            if (bVar10) goto LAB_002277f5;
            local_68.int_value_ = 0;
            uVar12 = 0;
            bVar10 = false;
            break;
          default:
            goto switchD_00227618_caseD_3;
          case 5:
            puVar17 = puVar9 + 1;
            puVar13 = (uint *)0x0;
            if (puVar17 <= puVar18) {
              puVar16 = (uint *)(ulong)*puVar9;
              goto LAB_00227680;
            }
LAB_00227599:
            local_68.int_value_ = 0;
            uVar12 = 0;
            bVar10 = false;
          }
LAB_00227840:
        } while (bVar10);
        local_68.size_ = (uint32_t)uVar12;
        local_68.type_ = (uint8_t)(uVar12 >> 0x30);
        local_68.id_ = (uint16_t)(uVar12 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool CommitDataRequest_ChunkToPatch::ParseFromArray(const void* raw, size_t size) {
  patches_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* target_buffer */:
        field.get(&target_buffer_);
        break;
      case 2 /* writer_id */:
        field.get(&writer_id_);
        break;
      case 3 /* chunk_id */:
        field.get(&chunk_id_);
        break;
      case 4 /* patches */:
        patches_.emplace_back();
        patches_.back().ParseFromArray(field.data(), field.size());
        break;
      case 5 /* has_more_patches */:
        field.get(&has_more_patches_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}